

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

int map_insert_array(map m,map_key *keys,map_value *values,size_t size)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (values == (map_value *)0x0 || (keys == (map_key *)0x0 || m == (map)0x0)) {
    pcVar4 = "Invalid map insertion parameters";
    uVar3 = 0xde;
  }
  else {
    sVar2 = 0;
    do {
      if (size == sVar2) {
        return 0;
      }
      iVar1 = map_insert(m,keys[sVar2],values[sVar2]);
      sVar2 = sVar2 + 1;
    } while (iVar1 == 0);
    pcVar4 = "Invalid map array insertion";
    uVar3 = 0xe6;
  }
  log_write_impl_va("metacall",uVar3,"map_insert_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                    ,3,pcVar4);
  return 1;
}

Assistant:

int map_insert_array(map m, map_key keys[], map_value values[], size_t size)
{
	size_t iterator;

	if (m == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (map_insert(m, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map array insertion");
			return 1;
		}
	}

	return 0;
}